

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::DeferScope::DeferScope(DeferScope *this,cmMakefile *mf,string *deferredInFile)

{
  cmMakefile *pcVar1;
  cmListFileContext local_120;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_b0 [2];
  undefined1 local_90 [8];
  cmListFileContext lfc;
  string *deferredInFile_local;
  cmMakefile *mf_local;
  DeferScope *this_local;
  
  this->Makefile = mf;
  lfc.DeferId.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = deferredInFile;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_90);
  lfc.FilePath.field_2._8_8_ = 0xffffffffffffffff;
  std::__cxx11::string::operator=
            ((string *)(lfc.Name.field_2._M_local_buf + 8),
             (string *)
             lfc.DeferId.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._32_8_);
  pcVar1 = this->Makefile;
  cmListFileContext::cmListFileContext(&local_120,(cmListFileContext *)local_90);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (local_b0,(cmListFileContext *)&pcVar1->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,(cmListFileBacktrace *)local_b0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_b0);
  cmListFileContext::~cmListFileContext(&local_120);
  this->Makefile->DeferRunning = true;
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_90);
  return;
}

Assistant:

DeferScope(cmMakefile* mf, std::string const& deferredInFile)
    : Makefile(mf)
  {
    cmListFileContext lfc;
    lfc.Line = cmListFileContext::DeferPlaceholderLine;
    lfc.FilePath = deferredInFile;
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    this->Makefile->DeferRunning = true;
  }